

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::set_priority(raft_server *this,int srv_id,int new_priority)

{
  element_type *peVar1;
  element_type *peVar2;
  _List_node_base *p_Var3;
  undefined8 uVar4;
  int iVar5;
  _List_node_base *p_Var6;
  undefined8 uVar7;
  long lVar8;
  _List_node_base *p_Var9;
  ptr<buffer> new_conf_buf;
  ptr<cluster_config> cloned_config;
  ptr<log_entry> entry;
  ptr<cluster_config> cur_config;
  ptr<buffer> enc_conf;
  unique_lock<std::recursive_mutex> guard;
  log_val_type local_ca;
  undefined1 local_c9;
  undefined1 local_c8 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  _List_node_base *local_90;
  ptr<log_entry> local_88;
  undefined1 local_78 [48];
  atomic<bool> local_48;
  unsigned_long local_40;
  __int_type local_38;
  
  local_78._40_8_ = &this->lock_;
  local_48._M_base._M_i = (__atomic_base<bool>)false;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)(local_78 + 0x28));
  local_48._M_base._M_i = (__atomic_base<bool>)true;
  if (this->id_ == (this->leader_).super___atomic_base<int>._M_i) {
    if ((new_priority == 0) && (this->id_ == srv_id)) {
      broadcast_priority_change(this,srv_id,0);
    }
    get_config((raft_server *)local_78);
    if ((this->uncommitted_config_).
        super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 != (element_type *)0x0) &&
         (iVar5 = (**(code **)(*(long *)peVar1 + 0x38))(), 3 < iVar5)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar2 = (this->uncommitted_config_).
                 super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_c8,"uncommitted config exists at log %lu, prev log %lu",
                   peVar2->log_idx_,peVar2->prev_log_idx_);
        (**(code **)(*(long *)peVar1 + 0x40))
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                   ,"set_priority",0x44,local_c8);
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_);
        }
      }
      local_78._0_8_ =
           (this->uncommitted_config_).
           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),
                 &(this->uncommitted_config_).
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    cluster_config::serialize((cluster_config *)(local_78 + 0x18));
    cluster_config::deserialize((cluster_config *)(local_c8 + 0x28),(buffer *)local_78._24_8_);
    p_Var9 = (((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                *)(local_c8._40_8_ + 0x38))->
             super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    p_Var6 = (_List_node_base *)(local_c8._40_8_ + 0x38);
    if (p_Var9 != p_Var6) {
      local_c8._32_4_ = new_priority;
      local_c8._36_4_ = srv_id;
      local_90 = p_Var6;
      local_78._16_8_ = this;
      do {
        p_Var3 = p_Var9[1]._M_next;
        if (*(uint *)&p_Var3->_M_next == srv_id) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar1 != (element_type *)0x0) &&
             (iVar5 = (**(code **)(*(long *)peVar1 + 0x38))(), p_Var6 = local_90, 3 < iVar5)) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_c8,"Change server %d priority %d -> %d",(ulong)(uint)srv_id,
                       (ulong)*(uint *)((long)&p_Var3[4]._M_prev + 4),(ulong)(uint)new_priority);
            (**(code **)(*(long *)peVar1 + 0x40))
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                       ,"set_priority",0x51,(string *)local_c8);
            new_priority = local_c8._32_4_;
            p_Var6 = local_90;
            this = (raft_server *)local_78._16_8_;
            srv_id = local_c8._36_4_;
            if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
              operator_delete((void *)local_c8._0_8_);
              p_Var6 = local_90;
              this = (raft_server *)local_78._16_8_;
              srv_id = local_c8._36_4_;
            }
          }
          *(int *)((long)&p_Var3[4]._M_prev + 4) = new_priority;
        }
        p_Var9 = p_Var9->_M_next;
      } while (p_Var9 != p_Var6);
    }
    uVar4 = local_c8._40_8_;
    uVar7 = (**(code **)(*(long *)(this->log_store_).
                                  super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 0x10))();
    *(ulong *)(uVar4 + 8) = *(ulong *)uVar4;
    *(undefined8 *)uVar4 = uVar7;
    cluster_config::serialize((cluster_config *)local_c8);
    local_38 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    local_ca = conf;
    lVar8 = std::chrono::_V2::system_clock::now();
    local_40 = lVar8 / 1000;
    local_88.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              (&local_88.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(log_entry **)&local_88,(allocator<nuraft::log_entry> *)&local_c9,
               &local_38,(shared_ptr<nuraft::buffer> *)local_c8,&local_ca,&local_40);
    this->config_changing_ = true;
    (this->uncommitted_config_).
    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_c8._40_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->uncommitted_config_).
                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_98);
    store_log_entry(this,&local_88,0);
    request_append_entries(this);
    if (local_88.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
    }
    if (local_78._32_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._32_8_);
    }
    if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (iVar5 = (**(code **)(*(long *)peVar1 + 0x38))(), 3 < iVar5)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_c8,
                 "Got set_priority request but I\'m not a leader: my ID %d, leader %d",
                 (ulong)(uint)this->id_,(ulong)(uint)(this->leader_).super___atomic_base<int>._M_i);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                 ,"set_priority",0x2a,local_c8);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
    if (((this->leader_).super___atomic_base<int>._M_i == -1) ||
       (((this->hb_alive_)._M_base._M_i & 1U) == 0)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 != (element_type *)0x0) &&
         (iVar5 = (**(code **)(*(long *)peVar1 + 0x38))(), 2 < iVar5)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_c8,"No live leader now, broadcast priority change");
        (**(code **)(*(long *)peVar1 + 0x40))
                  (peVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                   ,"set_priority",0x2d,local_c8);
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_);
        }
      }
      broadcast_priority_change(this,srv_id,new_priority);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)(local_78 + 0x28));
  return;
}

Assistant:

void raft_server::set_priority(const int srv_id, const int new_priority)
{
    recur_lock(lock_);

    // Do nothing if not a leader.
    if (id_ != leader_) {
        p_in("Got set_priority request but I'm not a leader: my ID %d, leader %d",
             id_, leader_.load());

        if (!is_leader_alive()) {
            p_wn("No live leader now, broadcast priority change");
            broadcast_priority_change(srv_id, new_priority);
        }
        return;
    }

    if (id_ == srv_id && new_priority == 0) {
        // Step down.
        // Even though current leader (myself) can send append_entries()
        // request, it cannot commit the priority change as it will
        // immediately yield its leadership.
        // So in this case, boradcast this change.
        broadcast_priority_change(srv_id, new_priority);
    }

    // Clone current cluster config.
    ptr<cluster_config> cur_config = get_config();

    // NOTE: Need to honor uncommitted config,
    //       refer to comment in `sync_log_to_new_srv()`
    if (uncommitted_config_) {
        p_in("uncommitted config exists at log %" PRIu64 ", prev log %" PRIu64,
             uncommitted_config_->get_log_idx(),
             uncommitted_config_->get_prev_log_idx());
        cur_config = uncommitted_config_;
    }

    ptr<buffer> enc_conf = cur_config->serialize();
    ptr<cluster_config> cloned_config = cluster_config::deserialize(*enc_conf);

    std::list<ptr<srv_config>>& s_confs = cloned_config->get_servers();

    for (auto& entry: s_confs) {
        srv_config* s_conf = entry.get();
        if (s_conf->get_id() == srv_id) {
            p_in("Change server %d priority %d -> %d",
                 srv_id, s_conf->get_priority(), new_priority);
            s_conf->set_priority(new_priority);
        }
    }

    // Create a log for new configuration, it should be replicated.
    cloned_config->set_log_idx(log_store_->next_slot());
    ptr<buffer> new_conf_buf(cloned_config->serialize());
    ptr<log_entry> entry( cs_new<log_entry>
                          ( state_->get_term(),
                            new_conf_buf,
                            log_val_type::conf,
                            timer_helper::get_timeofday_us() ) );

    config_changing_ = true;
    uncommitted_config_ = cloned_config;

    store_log_entry(entry);
    request_append_entries();
}